

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

void shell_pipe_cb(int param_1,void *param_2)

{
  Fl_Text_Display *this;
  int n;
  int iVar1;
  char *pcVar2;
  char *t;
  char line [1024];
  
  iVar1 = (int)line;
  t = line;
  memset(line,0,0x400);
  pcVar2 = Fl_Process::get_line(&s_proc,line,0x400);
  if (pcVar2 == (char *)0x0) {
    n = fileno((FILE *)s_proc._fpt);
    Fl::remove_fd(n);
    Fl_Process::close(&s_proc,iVar1);
    t = "... END SHELL COMMAND ...\n";
  }
  Fl_Text_Buffer::append(shell_run_buffer,t);
  this = shell_run_display;
  iVar1 = Fl_Text_Display::count_lines(shell_run_display,0,shell_run_buffer->mLength,true);
  Fl_Text_Display::scroll(this,iVar1,0);
  return;
}

Assistant:

void
shell_pipe_cb(FL_SOCKET, void*) {
  char	line[1024]="";		// Line from command output...

  if (s_proc.get_line(line, sizeof(line)) != NULL) {
    // Add the line to the output list...
    shell_run_buffer->append(line);
  } else {
    // End of file; tell the parent...
    Fl::remove_fd(fileno(s_proc.desc()));
    s_proc.close();
    shell_run_buffer->append("... END SHELL COMMAND ...\n");
  }

  shell_run_display->scroll(shell_run_display->count_lines(0,
                            shell_run_buffer->length(), 1), 0);
}